

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,float value)

{
  int32 iVar1;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar1 = WriteID(writer,type);
  if ((iVar1 == 0) && (iVar1 = WriteUInt(writer,4), iVar1 == 0)) {
    iVar1 = SerializeFloat(writer,value);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, float value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, 4))
    return false;

  if (SerializeFloat(writer, value))
    return false;

  return true;
}